

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O0

void QtPromisePrivate::PromiseDispatch<void>::
     call<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>,tst_future::fail()::__1,QString_const&>
               (QPromiseResolve<void> *resolve,QPromiseReject<void> *reject,
               anon_class_8_1_6971b95b fn,QString *args)

{
  QString *args_local;
  QPromiseReject<void> *reject_local;
  QPromiseResolve<void> *resolve_local;
  anon_class_8_1_6971b95b fn_local;
  
  resolve_local = (QPromiseResolve<void> *)fn.result;
  tst_future::fail::anon_class_8_1_6971b95b::operator()
            ((anon_class_8_1_6971b95b *)&resolve_local,args);
  QtPromise::QPromiseResolve<void>::operator()(resolve);
  return;
}

Assistant:

static void call(const Resolve& resolve, const Reject& reject, Functor fn, Args&&... args)
    {
        try {
            fn(std::forward<Args>(args)...);
            resolve();
        } catch (...) {
            reject(std::current_exception());
        }
    }